

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-type.c
# Opt level: O1

void coda_netcdf_type_delete(coda_dynamic_type *type)

{
  if (type == (coda_dynamic_type *)0x0) {
    __assert_fail("type != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-type.c"
                  ,0x27,"void coda_netcdf_type_delete(coda_dynamic_type *)");
  }
  if (type->backend == coda_backend_netcdf) {
    if ((type->definition->type_class == coda_array_class) &&
       (type[1].definition != (coda_type *)0x0)) {
      coda_dynamic_type_delete((coda_dynamic_type *)type[1].definition);
    }
    if (*(coda_dynamic_type **)(type + 1) != (coda_dynamic_type *)0x0) {
      coda_dynamic_type_delete(*(coda_dynamic_type **)(type + 1));
    }
    if (type->definition != (coda_type *)0x0) {
      coda_type_release(type->definition);
    }
    free(type);
    return;
  }
  __assert_fail("type->backend == coda_backend_netcdf",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-type.c"
                ,0x28,"void coda_netcdf_type_delete(coda_dynamic_type *)");
}

Assistant:

void coda_netcdf_type_delete(coda_dynamic_type *type)
{
    assert(type != NULL);
    assert(type->backend == coda_backend_netcdf);

    if (type->definition->type_class == coda_array_class)
    {
        if (((coda_netcdf_array *)type)->base_type != NULL)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)((coda_netcdf_array *)type)->base_type);
        }
    }
    if (((coda_netcdf_type *)type)->attributes != NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)((coda_netcdf_type *)type)->attributes);
    }
    if (type->definition != NULL)
    {
        coda_type_release((coda_type *)type->definition);
    }
    free(type);
}